

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yoml-parser.h
# Opt level: O0

int yoml__resolve_merge(yoml_t **target,yaml_parser_t *parser,yoml_parse_args_t *parse_args)

{
  yoml_t *node;
  yoml_t *src_00;
  int iVar1;
  size_t offset;
  yoml_mapping_element_t src;
  size_t j;
  size_t i;
  yoml_parse_args_t *parse_args_local;
  yaml_parser_t *parser_local;
  yoml_t **target_local;
  
  switch((*target)->type) {
  case YOML_TYPE_SCALAR:
    break;
  case YOML_TYPE_SEQUENCE:
    for (j = 0; (char *)j != ((*target)->data).scalar; j = j + 1) {
      iVar1 = yoml__resolve_merge((yoml_t **)((long)&(*target)->data + j * 8 + 8),parser,parse_args)
      ;
      if (iVar1 != 0) {
        return -1;
      }
    }
    break;
  case YOML_TYPE_MAPPING:
    if (((*target)->data).scalar != (char *)0x0) {
      j = ((*target)->data).sequence.size;
      do {
        offset = j - 1;
        iVar1 = yoml__resolve_merge((yoml_t **)(&(*target)->_refcnt + j * 2),parser,parse_args);
        if (iVar1 != 0) {
          return -1;
        }
        iVar1 = yoml__resolve_merge((yoml_t **)((long)&(*target)->data + j * 0x10),parser,parse_args
                                   );
        if (iVar1 != 0) {
          return -1;
        }
        if ((*(int *)(&(*target)->_refcnt)[j * 2] == 0) &&
           (iVar1 = strcmp(*(char **)((&(*target)->_refcnt)[j * 2] + 0x38),"<<"), iVar1 == 0)) {
          node = (yoml_t *)(&(*target)->_refcnt)[j * 2];
          src_00 = (yoml_t *)
                   ((anon_union_24_4_f8a395d4_for_data *)(&(*target)->_refcnt + j * 2 + 1))->scalar;
          memmove(&(*target)->_refcnt + j * 2,(void *)((long)&(*target)->data + j * 0x10 + 8),
                  (long)(((*target)->data).scalar + (-1 - offset)) * 0x10);
          ((*target)->data).scalar = (char *)(((*target)->data).sequence.size - 1);
          if (src_00->type == YOML_TYPE_SEQUENCE) {
            for (src.value = (yoml_t_conflict *)0x0;
                src.value != (yoml_t_conflict *)(src_00->data).scalar;
                src.value = (yoml_t_conflict *)((long)&(src.value)->type + 1)) {
              iVar1 = yoml__merge(target,offset,
                                  *(yoml_t **)((long)&src_00->data + (long)src.value * 8 + 8));
              if (iVar1 != 0) goto LAB_0020ec2b;
            }
          }
          else {
            iVar1 = yoml__merge(target,offset,src_00);
            if (iVar1 != 0) {
LAB_0020ec2b:
              if (parser != (yaml_parser_t *)0x0) {
                parser->problem =
                     "value of the merge key MUST be a mapping or a sequence of mappings";
                (parser->problem_mark).line = node->line;
                (parser->problem_mark).column = node->column;
              }
              return -1;
            }
          }
          yoml_free(node,parse_args->mem_set);
          yoml_free(src_00,parse_args->mem_set);
        }
        j = offset;
      } while (offset != 0);
    }
    break;
  case YOML__TYPE_UNRESOLVED_ALIAS:
    __assert_fail("!\"unreachable\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/yoml/yoml-parser.h"
                  ,0x10c,"int yoml__resolve_merge(yoml_t **, yaml_parser_t *, yoml_parse_args_t *)")
    ;
  }
  return 0;
}

Assistant:

static inline int yoml__resolve_merge(yoml_t **target, yaml_parser_t *parser, yoml_parse_args_t *parse_args)
{
    size_t i, j;

    switch ((*target)->type) {
    case YOML_TYPE_SCALAR:
        break;
    case YOML_TYPE_SEQUENCE:
        for (i = 0; i != (*target)->data.sequence.size; ++i) {
            if (yoml__resolve_merge((*target)->data.sequence.elements + i, parser, parse_args) != 0)
                return -1;
        }
        break;
    case YOML_TYPE_MAPPING:
        if ((*target)->data.mapping.size != 0) {
            i = (*target)->data.mapping.size;
            do {
                --i;
                if (yoml__resolve_merge(&(*target)->data.mapping.elements[i].key, parser, parse_args) != 0)
                    return -1;
                if (yoml__resolve_merge(&(*target)->data.mapping.elements[i].value, parser, parse_args) != 0)
                    return -1;
                if ((*target)->data.mapping.elements[i].key->type == YOML_TYPE_SCALAR &&
                    strcmp((*target)->data.mapping.elements[i].key->data.scalar, "<<") == 0) {
                    /* erase the slot (as well as preserving the values) */
                    yoml_mapping_element_t src = (*target)->data.mapping.elements[i];
                    memmove((*target)->data.mapping.elements + i, (*target)->data.mapping.elements + i + 1,
                            ((*target)->data.mapping.size - i - 1) * sizeof((*target)->data.mapping.elements[0]));
                    --(*target)->data.mapping.size;
                    /* merge */
                    if (src.value->type == YOML_TYPE_SEQUENCE) {
                        for (j = 0; j != src.value->data.sequence.size; ++j)
                            if (yoml__merge(target, i, src.value->data.sequence.elements[j]) != 0) {
                            MergeError:
                                if (parser != NULL) {
                                    parser->problem = "value of the merge key MUST be a mapping or a sequence of mappings";
                                    parser->problem_mark.line = src.key->line;
                                    parser->problem_mark.column = src.key->column;
                                }
                                return -1;
                            }
                    } else {
                        if (yoml__merge(target, i, src.value) != 0)
                            goto MergeError;
                    }
                    /* cleanup */
                    yoml_free(src.key, parse_args->mem_set);
                    yoml_free(src.value, parse_args->mem_set);
                }
            } while (i != 0);
        }
        break;
    case YOML__TYPE_UNRESOLVED_ALIAS:
        assert(!"unreachable");
        break;
    }

    return 0;
}